

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall ValidateVulnerability::CheckDamageBinID(ValidateVulnerability *this)

{
  ValidateVulnerability *this_local;
  
  if ((this->v_).damage_bin_id + -1 != this->prevDamageBinID_) {
    if (this->prevDamageBinID_ == 0) {
      fprintf(_stderr,
              "ERROR: First damage bin ID (damage bin ID = %d) on line %d is not 1 for vulnerability ID %d and intensity bin ID %d:\n%s\n"
              ,(ulong)(uint)(this->v_).damage_bin_id,(ulong)(uint)(this->super_Validate).lineno_,
              (ulong)(uint)(this->v_).vulnerability_id,(ulong)(uint)(this->v_).intensity_bin_id,
              &this->super_Validate);
    }
    else {
      fprintf(_stderr,
              "ERROR: Non-contiguous damage bin IDs %d on line %d and %d on line %d:\n%s\n%s\n",
              (ulong)(uint)this->prevDamageBinID_,(ulong)((this->super_Validate).lineno_ - 1),
              (ulong)(uint)(this->v_).damage_bin_id,(ulong)(uint)(this->super_Validate).lineno_,
              this->prevLine_,&this->super_Validate);
    }
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  return;
}

Assistant:

inline void ValidateVulnerability::CheckDamageBinID() {

  if ((v_.damage_bin_id - 1) != prevDamageBinID_) {

    if (prevDamageBinID_ == 0) {
      fprintf(stderr, "ERROR: First damage bin ID (damage bin ID = %d) on"
		      " line %d is not 1 for vulnerability ID %d and"
		      " intensity bin ID %d:\n%s\n",
	      v_.damage_bin_id, lineno_, v_.vulnerability_id,
	      v_.intensity_bin_id, line_);
    } else {
      fprintf(stderr, "ERROR: Non-contiguous damage bin IDs %d on line %d"
		      " and %d on line %d:\n%s\n%s\n",
	      prevDamageBinID_, lineno_ - 1, v_.damage_bin_id, lineno_,
	      prevLine_, line_);
    }

    PrintErrorMessage();

  }

}